

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thecl06.c
# Opt level: O0

char * th06_find_format(uint version,uint id,_Bool is_timeline)

{
  char *pcVar1;
  seqmap_entry_t *psVar2;
  char *local_30;
  char *ret;
  seqmap_entry_t *ent;
  _Bool is_timeline_local;
  uint id_local;
  uint version_local;
  
  if (is_timeline) {
    pcVar1 = th06_find_timeline_format(version,id);
    return pcVar1;
  }
  psVar2 = seqmap_get(g_eclmap->ins_signatures,id);
  if (psVar2 != (seqmap_entry_t *)0x0) {
    return psVar2->value;
  }
  if (version == 6) {
    local_30 = find_format(th06_fmts,id);
  }
  else if (version == 7) {
    local_30 = find_format(th07_fmts,id);
  }
  else {
    if (version != 8) {
      if (version != 9) {
        if (version != 0x5f) {
          fprintf(_stderr,"%s: unsupported version: %u\n",argv0,(ulong)version);
          return (char *)0x0;
        }
        local_30 = find_format(th95_fmts,id);
        if (local_30 == (char *)0x0) {
          local_30 = find_format(th08_fmts,id);
        }
        goto LAB_0011c4bb;
      }
      local_30 = find_format(th09_fmts,id);
      if (local_30 != (char *)0x0) goto LAB_0011c4bb;
    }
    local_30 = find_format(th08_fmts,id);
  }
LAB_0011c4bb:
  if (local_30 == (char *)0x0) {
    fprintf(_stderr,"%s: id %d was not found in the format table\n",argv0,(ulong)id);
  }
  return local_30;
}

Assistant:

static const char*
th06_find_format(
    unsigned int version,
    unsigned int id,
    bool is_timeline)
{
    if (is_timeline) return th06_find_timeline_format(version, id);

    seqmap_entry_t *ent = seqmap_get(g_eclmap->ins_signatures, id);
    if (ent)
        return ent->value;

    const char* ret = NULL;

    switch (version) {
    case 95:
        if ((ret = find_format(th95_fmts, id))) break;
        ret = find_format(th08_fmts, id);
        break;
    case 9:
        if ((ret = find_format(th09_fmts, id))) break; /* fallthrough */
    case 8:
        ret = find_format(th08_fmts, id);
        break;
    case 7:
        ret = find_format(th07_fmts, id);
        break;
    case 6:
        ret = find_format(th06_fmts, id);
        break;
    default:
        fprintf(stderr, "%s: unsupported version: %u\n", argv0, version);
        return NULL;
    }

    if (!ret)
        fprintf(stderr, "%s: id %d was not found in the format table\n", argv0, id);

    return ret;
}